

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O1

void rw::Image::setSearchPath(char *path)

{
  int *piVar1;
  long lVar2;
  char *__s;
  char *pcVar3;
  long lVar4;
  
  lVar2 = engine;
  lVar4 = (long)imageModuleOffset;
  (*DAT_00149de0)(*(undefined8 *)(engine + lVar4));
  *(undefined4 *)(lVar2 + 8 + lVar4) = 0;
  if (path == (char *)0x0) {
    *(undefined8 *)(lVar2 + lVar4) = 0;
  }
  else {
    __s = strdup_LOC(path,0x30000,
                     "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/image.cpp line: 905"
                    );
    *(char **)(lVar2 + lVar4) = __s;
    while ((__s != (char *)0x0 && (*__s != '\0'))) {
      pcVar3 = strchr(__s,0x3b);
      if (pcVar3 == (char *)0x0) {
        __s = (char *)0x0;
      }
      else {
        __s = pcVar3 + 1;
        *pcVar3 = '\0';
      }
      piVar1 = (int *)(lVar2 + 8 + lVar4);
      *piVar1 = *piVar1 + 1;
    }
  }
  return;
}

Assistant:

void
Image::setSearchPath(const char *path)
{
	char *p, *end;
	ImageGlobals *g = PLUGINOFFSET(ImageGlobals, engine, imageModuleOffset);
	rwFree(g->searchPaths);
	g->numSearchPaths = 0;
	if(path)
		g->searchPaths = p = rwStrdup(path, MEMDUR_EVENT);
	else{
		g->searchPaths = nil;
		return;
	}
	while(p && *p){
		end = strchr(p, ';');
		if(end)
			*end++ = '\0';
		g->numSearchPaths++;
		p = end;
	}
}